

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O1

REF_STATUS ref_export_bin_ugrid_int(FILE *file,REF_BOOL swap,REF_BOOL fat,REF_INT output)

{
  size_t sVar1;
  undefined8 uVar2;
  char *pcVar3;
  REF_INT actual_1;
  REF_LONG actual;
  uint local_c;
  ulong local_8;
  
  if (fat == 0) {
    local_c = output;
    if (swap != 0) {
      local_c = (uint)output >> 0x18 | (output & 0xff0000U) >> 8 | (output & 0xff00U) << 8 |
                output << 0x18;
    }
    sVar1 = fwrite(&local_c,4,1,(FILE *)file);
    if (sVar1 == 1) {
      return 0;
    }
    pcVar3 = "output int";
    uVar2 = 0x616;
  }
  else {
    local_8 = (ulong)output;
    if (swap != 0) {
      local_8 = local_8 >> 0x38 | (local_8 & 0xff000000000000) >> 0x28 |
                (local_8 & 0xff0000000000) >> 0x18 | (local_8 & 0xff00000000) >> 8 |
                (local_8 & 0xff000000) << 8 | (local_8 & 0xff0000) << 0x18 |
                (local_8 & 0xff00) << 0x28 | local_8 << 0x38;
    }
    sVar1 = fwrite(&local_8,8,1,(FILE *)file);
    if (sVar1 == 1) {
      return 0;
    }
    pcVar3 = "output long";
    uVar2 = 0x611;
  }
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar2,
         "ref_export_bin_ugrid_int",pcVar3,1,sVar1);
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_export_bin_ugrid_int(FILE *file, REF_BOOL swap,
                                                   REF_BOOL fat,
                                                   REF_INT output) {
  if (fat) {
    REF_LONG actual;
    actual = (REF_LONG)output;
    if (swap) SWAP_LONG(actual);
    REIS(1, fwrite(&actual, sizeof(REF_LONG), 1, file), "output long");
  } else {
    REF_INT actual;
    actual = output;
    if (swap) SWAP_INT(actual);
    REIS(1, fwrite(&actual, sizeof(REF_INT), 1, file), "output int");
  }
  return REF_SUCCESS;
}